

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.cc
# Opt level: O0

void __thiscall serial::MillisecondTimer::MillisecondTimer(MillisecondTimer *this,uint32_t millis)

{
  long lVar1;
  timespec tVar2;
  int64_t sec_diff;
  int64_t tv_nsec;
  uint32_t millis_local;
  MillisecondTimer *this_local;
  
  tVar2 = timespec_now();
  this->expiry = tVar2;
  lVar1 = (long)((double)millis * 1000000.0 + (double)(this->expiry).tv_nsec);
  if ((double)lVar1 < 1000000000.0) {
    (this->expiry).tv_nsec = lVar1;
  }
  else {
    (this->expiry).tv_nsec = lVar1 % 1000000000;
    (this->expiry).tv_sec = lVar1 / 1000000000 + (this->expiry).tv_sec;
  }
  return;
}

Assistant:

MillisecondTimer::MillisecondTimer (const uint32_t millis)
  : expiry(timespec_now())
{
  int64_t tv_nsec = expiry.tv_nsec + (millis * 1e6);
  if (tv_nsec >= 1e9) {
    int64_t sec_diff = tv_nsec / static_cast<int> (1e9);
    expiry.tv_nsec = tv_nsec % static_cast<int>(1e9);
    expiry.tv_sec += sec_diff;
  } else {
    expiry.tv_nsec = tv_nsec;
  }
}